

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_field_convert(void)

{
  int iVar1;
  secp256k1_fe_storage fes2;
  uchar b322 [32];
  secp256k1_fe fe2;
  secp256k1_fe *in_stack_ffffffffffffff88;
  secp256k1_fe *in_stack_ffffffffffffff90;
  undefined1 local_58 [16];
  secp256k1_fe *in_stack_ffffffffffffffb8;
  secp256k1_fe *in_stack_ffffffffffffffc0;
  
  iVar1 = secp256k1_fe_set_b32_limit(in_stack_ffffffffffffff88,(uchar *)0x119775);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0xb2a,"test condition failed: secp256k1_fe_set_b32_limit(&fe2, b32)");
    abort();
  }
  iVar1 = secp256k1_fe_equal(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0xb2b,"test condition failed: secp256k1_fe_equal(&fe, &fe2)");
    abort();
  }
  secp256k1_fe_from_storage
            (in_stack_ffffffffffffff90,(secp256k1_fe_storage *)in_stack_ffffffffffffff88);
  iVar1 = secp256k1_fe_equal(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0xb2d,"test condition failed: secp256k1_fe_equal(&fe, &fe2)");
    abort();
  }
  secp256k1_fe_get_b32((uchar *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  iVar1 = secp256k1_memcmp_var(local_58,"",0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0xb30,"test condition failed: secp256k1_memcmp_var(b322, b32, 32) == 0");
    abort();
  }
  secp256k1_fe_to_storage
            ((secp256k1_fe_storage *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  iVar1 = secp256k1_memcmp_var(&stack0xffffffffffffff88,&run_field_convert::fes,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0xb32,"test condition failed: secp256k1_memcmp_var(&fes2, &fes, sizeof(fes)) == 0");
    abort();
  }
  return;
}

Assistant:

static void run_field_convert(void) {
    static const unsigned char b32[32] = {
        0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07,
        0x11, 0x12, 0x13, 0x14, 0x15, 0x16, 0x17, 0x18,
        0x22, 0x23, 0x24, 0x25, 0x26, 0x27, 0x28, 0x29,
        0x33, 0x34, 0x35, 0x36, 0x37, 0x38, 0x39, 0x40
    };
    static const secp256k1_fe_storage fes = SECP256K1_FE_STORAGE_CONST(
        0x00010203UL, 0x04050607UL, 0x11121314UL, 0x15161718UL,
        0x22232425UL, 0x26272829UL, 0x33343536UL, 0x37383940UL
    );
    static const secp256k1_fe fe = SECP256K1_FE_CONST(
        0x00010203UL, 0x04050607UL, 0x11121314UL, 0x15161718UL,
        0x22232425UL, 0x26272829UL, 0x33343536UL, 0x37383940UL
    );
    secp256k1_fe fe2;
    unsigned char b322[32];
    secp256k1_fe_storage fes2;
    /* Check conversions to fe. */
    CHECK(secp256k1_fe_set_b32_limit(&fe2, b32));
    CHECK(secp256k1_fe_equal(&fe, &fe2));
    secp256k1_fe_from_storage(&fe2, &fes);
    CHECK(secp256k1_fe_equal(&fe, &fe2));
    /* Check conversion from fe. */
    secp256k1_fe_get_b32(b322, &fe);
    CHECK(secp256k1_memcmp_var(b322, b32, 32) == 0);
    secp256k1_fe_to_storage(&fes2, &fe);
    CHECK(secp256k1_memcmp_var(&fes2, &fes, sizeof(fes)) == 0);
}